

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void releaseMouseGrabOfWidget(QWidget *widget)

{
  QWindow *pQVar1;
  QWidget *in_RDI;
  QWindow *window;
  QWidget *in_stack_fffffffffffffff0;
  
  if ((qt_mouseGrb == in_RDI) &&
     (pQVar1 = grabberWindow(in_stack_fffffffffffffff0), pQVar1 != (QWindow *)0x0)) {
    if ((mouseGrabWithCursor & 1U) != 0) {
      QGuiApplication::restoreOverrideCursor();
      mouseGrabWithCursor = false;
    }
    QWindow::setMouseGrabEnabled(SUB81(pQVar1,0));
  }
  qt_mouseGrb = (QWidget *)0x0;
  return;
}

Assistant:

static void releaseMouseGrabOfWidget(QWidget *widget)
{
    if (qt_mouseGrb == widget) {
        if (QWindow *window = grabberWindow(widget)) {
#ifndef QT_NO_CURSOR
            if (mouseGrabWithCursor) {
                QGuiApplication::restoreOverrideCursor();
                mouseGrabWithCursor = false;
            }
#endif // !QT_NO_CURSOR
            window->setMouseGrabEnabled(false);
        }
    }
    qt_mouseGrb = nullptr;
}